

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O0

string * __thiscall OpenMD::RNEMD::RNEMD::setSelection_abi_cxx11_(RNEMD *this,RealType *slabCenter)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  ostream *poVar4;
  double *in_RDX;
  long in_RSI;
  Snapshot *in_RDI;
  ostringstream selectionStream;
  RealType *rightSlabBoundary;
  Vector3d rightSlab;
  RealType *leftSlabBoundary;
  Vector3d leftSlab;
  RealType hmat_2;
  Vector3d tempSlabCenter;
  bool printSlabCenterWarning;
  Vector3<double> *in_stack_fffffffffffffd58;
  Vector3<double> *in_stack_fffffffffffffd60;
  Snapshot *this_00;
  ostringstream local_1f8 [376];
  double *local_80;
  Vector<double,_3U> local_78;
  double *local_60;
  Vector<double,_3U> local_58;
  double local_40;
  Vector<double,_3U> local_38;
  byte local_19;
  double *local_18;
  
  local_19 = 0;
  this_00 = in_RDI;
  local_18 = in_RDX;
  Vector3<double>::Vector3(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  dVar1 = *local_18;
  pdVar3 = Vector<double,_3U>::operator[](&local_38,*(uint *)(in_RSI + 0x240));
  *pdVar3 = dVar1;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()
                     ((RectMatrix<double,_3U,_3U> *)(in_RSI + 0x18),*(uint *)(in_RSI + 0x240),
                      *(uint *)(in_RSI + 0x240));
  local_40 = *pdVar3 / 2.0;
  if (*local_18 <= local_40) {
    if (*local_18 < -local_40) {
      Snapshot::wrapVector(this_00,(Vector3d *)in_RDI);
      local_19 = 1;
    }
  }
  else {
    Snapshot::wrapVector(this_00,(Vector3d *)in_RDI);
    local_19 = 1;
  }
  if ((local_19 & 1) != 0) {
    dVar1 = *local_18;
    pdVar3 = Vector<double,_3U>::operator[](&local_38,*(uint *)(in_RSI + 0x240));
    snprintf(painCave.errMsg,2000,
             "The given slab center was set to %0.2f. In the wrapped coordinates\n\t[-Hmat/2, +Hmat/2], this has been remapped to %0.2f.\n"
             ,dVar1,*pdVar3);
    painCave.isFatal = 0;
    painCave.severity = 2;
    simError();
    pdVar3 = Vector<double,_3U>::operator[](&local_38,*(uint *)(in_RSI + 0x240));
    *local_18 = *pdVar3;
  }
  Vector3<double>::Vector3(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  local_60 = Vector<double,_3U>::operator[](&local_58,*(uint *)(in_RSI + 0x240));
  dVar1 = *local_18;
  dVar2 = *(double *)(in_RSI + 0x60);
  pdVar3 = Vector<double,_3U>::operator[](&local_58,*(uint *)(in_RSI + 0x240));
  *pdVar3 = dVar2 * -0.5 + dVar1;
  Snapshot::wrapVector(this_00,(Vector3d *)in_RDI);
  Vector3<double>::Vector3(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  local_80 = Vector<double,_3U>::operator[](&local_78,*(uint *)(in_RSI + 0x240));
  dVar1 = *local_18;
  dVar2 = *(double *)(in_RSI + 0x60);
  pdVar3 = Vector<double,_3U>::operator[](&local_78,*(uint *)(in_RSI + 0x240));
  *pdVar3 = dVar2 * 0.5 + dVar1;
  Snapshot::wrapVector(this_00,(Vector3d *)in_RDI);
  std::__cxx11::ostringstream::ostringstream(local_1f8);
  poVar4 = std::operator<<((ostream *)local_1f8,"select wrapped");
  poVar4 = std::operator<<(poVar4,(string *)(in_RSI + 0x338));
  poVar4 = std::operator<<(poVar4," >= ");
  std::ostream::operator<<(poVar4,*local_60);
  if (*local_60 < *local_80 || *local_60 == *local_80) {
    poVar4 = std::operator<<((ostream *)local_1f8," && wrapped");
    poVar4 = std::operator<<(poVar4,(string *)(in_RSI + 0x338));
    poVar4 = std::operator<<(poVar4," < ");
    std::ostream::operator<<(poVar4,*local_80);
  }
  else {
    poVar4 = std::operator<<((ostream *)local_1f8," || wrapped");
    poVar4 = std::operator<<(poVar4,(string *)(in_RSI + 0x338));
    poVar4 = std::operator<<(poVar4," < ");
    std::ostream::operator<<(poVar4,*local_80);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1f8);
  return (string *)this_00;
}

Assistant:

std::string RNEMD::setSelection(RealType& slabCenter) {
    bool printSlabCenterWarning {false};

    Vector3d tempSlabCenter {V3Zero};
    tempSlabCenter[rnemdPrivilegedAxis_] = slabCenter;

    RealType hmat_2 = hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_) / 2.0;

    if (slabCenter > hmat_2) {
      currentSnap_->wrapVector(tempSlabCenter);
      printSlabCenterWarning = true;
    } else if (slabCenter < -hmat_2) {
      currentSnap_->wrapVector(tempSlabCenter);
      printSlabCenterWarning = true;
    }

    if (printSlabCenterWarning) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "The given slab center was set to %0.2f. In the wrapped "
               "coordinates\n"
               "\t[-Hmat/2, +Hmat/2], this has been remapped to %0.2f.\n",
               slabCenter, tempSlabCenter[rnemdPrivilegedAxis_]);
      painCave.isFatal  = 0;
      painCave.severity = OPENMD_WARNING;
      simError();

      slabCenter = tempSlabCenter[rnemdPrivilegedAxis_];
    }

    Vector3d leftSlab {V3Zero};
    const RealType& leftSlabBoundary = leftSlab[rnemdPrivilegedAxis_];
    leftSlab[rnemdPrivilegedAxis_]   = slabCenter - 0.5 * slabWidth_;
    currentSnap_->wrapVector(leftSlab);

    Vector3d rightSlab {V3Zero};
    const RealType& rightSlabBoundary = rightSlab[rnemdPrivilegedAxis_];
    rightSlab[rnemdPrivilegedAxis_]   = slabCenter + 0.5 * slabWidth_;
    currentSnap_->wrapVector(rightSlab);

    std::ostringstream selectionStream;

    selectionStream << "select wrapped" << rnemdAxisLabel_
                    << " >= " << leftSlabBoundary;

    if (leftSlabBoundary > rightSlabBoundary)
      selectionStream << " || wrapped" << rnemdAxisLabel_ << " < "
                      << rightSlabBoundary;
    else
      selectionStream << " && wrapped" << rnemdAxisLabel_ << " < "
                      << rightSlabBoundary;

    return selectionStream.str();
  }